

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_trust_anchors_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  Array<unsigned_char> *pAVar3;
  uchar *data;
  size_t len;
  undefined1 local_90 [8];
  CBB list;
  CBB contents;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = std::optional<bssl::Array<unsigned_char>_>::has_value
                    (&hs->config->requested_trust_anchors);
  if (bVar1) {
    iVar2 = CBB_add_u16(out_compressible,0xca34);
    if (((iVar2 != 0) &&
        (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&list.u + 0x18)),
        iVar2 != 0)) &&
       (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&list.u + 0x18),(CBB *)local_90),
       iVar2 != 0)) {
      pAVar3 = std::optional<bssl::Array<unsigned_char>_>::operator->
                         (&hs->config->requested_trust_anchors);
      data = Array<unsigned_char>::data(pAVar3);
      pAVar3 = std::optional<bssl::Array<unsigned_char>_>::operator->
                         (&hs->config->requested_trust_anchors);
      len = Array<unsigned_char>::size(pAVar3);
      iVar2 = CBB_add_bytes((CBB *)local_90,data,len);
      if ((iVar2 != 0) && (iVar2 = CBB_flush(out_compressible), iVar2 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  else {
    hs_local._7_1_ = true;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_trust_anchors_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                              CBB *out_compressible,
                                              ssl_client_hello_type_t type) {
  if (!hs->config->requested_trust_anchors.has_value()) {
    return true;
  }
  // TODO(crbug.com/398275713): What should this send in ClientHelloOuter?
  CBB contents, list;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_trust_anchors) ||  //
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||  //
      !CBB_add_u16_length_prefixed(&contents, &list) ||             //
      !CBB_add_bytes(&list, hs->config->requested_trust_anchors->data(),
                     hs->config->requested_trust_anchors->size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }
  return true;
}